

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O2

int TVMFuncCall(TVMFunctionHandle func,TVMValue_conflict *args,int *arg_type_codes,int num_args,
               TVMValue_conflict *ret_val,int *ret_type_code)

{
  TVMArgs __args;
  int iVar1;
  TVMRuntimeEntry *this;
  TVMByteArray *pTVar2;
  TVMRetValue rv;
  string local_40;
  
  rv.super_TVMPODValue_.type_code_ = 4;
  if (func != (TVMFunctionHandle)0x0) {
    __args._20_4_ = local_40.field_2._M_allocated_capacity._4_4_;
    __args.num_args = num_args;
    __args.type_codes = arg_type_codes;
    __args.values = args;
    local_40._M_dataplus._M_p = (pointer)args;
    local_40._M_string_length = (size_type)arg_type_codes;
    local_40.field_2._M_allocated_capacity._0_4_ = num_args;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::operator()
              ((function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)func,__args,
               &rv);
    if (((uint)rv.super_TVMPODValue_.type_code_ < 0xd) &&
       ((0x1820U >> (rv.super_TVMPODValue_.type_code_ & 0x1fU) & 1) != 0)) {
      this = dmlc::ThreadLocalStore<TVMRuntimeEntry>::Get();
      if (rv.super_TVMPODValue_.type_code_ == 5) {
        tvm::runtime::TVMRetValue::operator_cast_to_string(&local_40,&rv);
        std::__cxx11::string::operator=((string *)this,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      else {
        std::__cxx11::string::_M_assign((string *)this);
      }
      pTVar2 = (TVMByteArray *)(this->ret_str)._M_dataplus._M_p;
      if (rv.super_TVMPODValue_.type_code_ == 0xc) {
        (this->ret_bytes).data = (char *)pTVar2;
        pTVar2 = &this->ret_bytes;
        (this->ret_bytes).size = (this->ret_str)._M_string_length;
        iVar1 = 0xc;
      }
      else {
        iVar1 = 0xb;
      }
      *ret_type_code = iVar1;
      ret_val->v_handle = pTVar2;
    }
    else {
      tvm::runtime::TVMRetValue::MoveToCHost(&rv,ret_val,ret_type_code);
    }
    tvm::runtime::TVMRetValue::~TVMRetValue(&rv);
    return 0;
  }
  __assert_fail("func != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/c_runtime_api.cc"
                ,0x1be,
                "int TVMFuncCall(TVMFunctionHandle, TVMValue *, int *, int, TVMValue *, int *)");
}

Assistant:

int TVMFuncCall(TVMFunctionHandle func,
                TVMValue *args,
                int *arg_type_codes,
                int num_args,
                TVMValue *ret_val,
                int *ret_type_code) {
  API_BEGIN();
  TVMRetValue rv;
#ifdef DEBUG_DLR
  std::cout << "[TVMFuncCall]" << std::endl;
#endif
  assert(func != 0);

  (*static_cast<const PackedFunc *>(func)).CallPacked(TVMArgs(args, arg_type_codes, num_args), &rv);
  // handle return string.
  if (rv.type_code() == kStr ||
      rv.type_code() == kTVMType ||
      rv.type_code() == kBytes) {
    TVMRuntimeEntry *e = TVMAPIRuntimeStore::Get();
    if (rv.type_code() != kTVMType) {
      e->ret_str = *rv.ptr<std::string>();
    } else {
      e->ret_str = rv.operator std::string();
    }
    if (rv.type_code() == kBytes) {
      e->ret_bytes.data = e->ret_str.c_str();
      e->ret_bytes.size = e->ret_str.length();
      *ret_type_code = kBytes;
      ret_val->v_handle = &(e->ret_bytes);
    } else {
      *ret_type_code = kStr;
      ret_val->v_str = e->ret_str.c_str();
    }
  } else {
    rv.MoveToCHost(ret_val, ret_type_code);
  }
  API_END();
}